

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzer.cpp
# Opt level: O0

void __thiscall
PS2KeyboardAnalyzer::GetNextData
          (PS2KeyboardAnalyzer *this,U64 *starting_frame,U64 *ending_frame,bool *DeviceToHost,
          U64 *Payload,bool *ParityError,bool *ACKed)

{
  AnalyzerChannelData *pAVar1;
  byte bVar2;
  int iVar3;
  MarkerType MVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  U64 UVar8;
  element_type *peVar9;
  bool bVar10;
  uint local_78;
  int received_parity;
  U32 i;
  DataBuilder local_68 [8];
  DataBuilder data_builder;
  U64 data;
  U64 current_location;
  U64 NextEdgeClock;
  U64 NextEdgeData;
  bool gotdata;
  bool *ParityError_local;
  U64 *Payload_local;
  bool *DeviceToHost_local;
  U64 *ending_frame_local;
  U64 *starting_frame_local;
  PS2KeyboardAnalyzer *this_local;
  
  bVar10 = false;
  do {
    if (bVar10) {
      return;
    }
    iVar3 = AnalyzerChannelData::GetBitState();
    if (iVar3 == 0) {
      pAVar1 = this->mData;
      AnalyzerChannelData::GetSampleOfNextEdge();
      uVar6 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)pAVar1);
      if (((uVar6 & 1) == 0) || (iVar3 = AnalyzerChannelData::GetBitState(), iVar3 != 1))
      goto LAB_00106420;
      *DeviceToHost = false;
    }
    else {
LAB_00106420:
      while( true ) {
        iVar3 = AnalyzerChannelData::GetBitState();
        bVar10 = false;
        if (iVar3 == 1) {
          iVar3 = AnalyzerChannelData::GetBitState();
          bVar10 = iVar3 == 1;
        }
        if (!bVar10) break;
        uVar6 = AnalyzerChannelData::GetSampleOfNextEdge();
        uVar7 = AnalyzerChannelData::GetSampleOfNextEdge();
        if (uVar6 < uVar7) {
          AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mClock);
          AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mData);
        }
        else {
          AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mClock);
          AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mData);
        }
      }
      iVar3 = AnalyzerChannelData::GetBitState();
      if (iVar3 == 0) {
        pAVar1 = this->mData;
        AnalyzerChannelData::GetSampleOfNextEdge();
        uVar6 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)pAVar1);
        if (((uVar6 & 1) != 0) && (iVar3 = AnalyzerChannelData::GetBitState(), iVar3 == 1)) {
          *DeviceToHost = false;
          goto LAB_0010653e;
        }
      }
      *DeviceToHost = true;
    }
LAB_0010653e:
    AnalyzerChannelData::AdvanceToNextEdge();
    pAVar1 = this->mData;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar1);
    UVar8 = AnalyzerChannelData::GetSampleNumber();
    *starting_frame = UVar8;
    iVar3 = AnalyzerChannelData::GetBitState();
    if (iVar3 == 0) {
      peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
      std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
      MVar4 = (MarkerType)UVar8;
      AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x8);
      if ((*DeviceToHost & 1U) == 0) {
        peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
        std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x4);
      }
      else {
        peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
        std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x5);
      }
      _data_builder = 0;
      DataBuilder::DataBuilder(local_68);
      DataBuilder::Reset((ulonglong *)local_68,(ShiftOrder)&data_builder,1);
      for (local_78 = 0; local_78 < 8; local_78 = local_78 + 1) {
        AnalyzerChannelData::AdvanceToNextEdge();
        AnalyzerChannelData::AdvanceToNextEdge();
        MVar4 = AnalyzerChannelData::GetSampleNumber();
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mData);
        if ((*DeviceToHost & 1U) == 0) {
          peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
          std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
          AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x4);
        }
        else {
          peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
          std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
          AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x5);
        }
        peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
        std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x0);
        AnalyzerChannelData::GetBitState();
        DataBuilder::AddBit((BitState)local_68);
      }
      *Payload = _data_builder;
      AnalyzerChannelData::AdvanceToNextEdge();
      AnalyzerChannelData::AdvanceToNextEdge();
      MVar4 = AnalyzerChannelData::GetSampleNumber();
      if ((*DeviceToHost & 1U) == 0) {
        peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
        std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x4);
      }
      else {
        peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
        std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x5);
      }
      AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mData);
      iVar3 = AnalyzerChannelData::GetBitState();
      uVar5 = AnalyzerHelpers::GetOnesCount(_data_builder);
      bVar2 = AnalyzerHelpers::IsOdd((ulong)uVar5);
      if ((bVar2 & 1) == 0) {
        if (iVar3 == 1) {
          peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
          std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
          AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x2);
          *ParityError = false;
        }
        else {
          peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
          std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
          AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x7);
          *ParityError = true;
        }
      }
      else if (iVar3 == 0) {
        peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
        std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x2);
        *ParityError = false;
      }
      else {
        peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
        std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x7);
        *ParityError = true;
      }
      AnalyzerChannelData::AdvanceToNextEdge();
      AnalyzerChannelData::AdvanceToNextEdge();
      MVar4 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mData);
      if ((*DeviceToHost & 1U) == 0) {
        peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
        std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x4);
      }
      else {
        peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
        std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x5);
      }
      iVar3 = AnalyzerChannelData::GetBitState();
      if (iVar3 == 1) {
        peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
        std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x9);
      }
      else {
        peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
        std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x7);
      }
      if ((*DeviceToHost & 1U) == 0) {
        AnalyzerChannelData::AdvanceToNextEdge();
        AnalyzerChannelData::AdvanceToNextEdge();
        MVar4 = AnalyzerChannelData::GetSampleNumber();
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mData);
        peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
        std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x4);
        iVar3 = AnalyzerChannelData::GetBitState();
        if (iVar3 == 1) {
          *ACKed = true;
          peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
          std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
          AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x7);
        }
        else {
          *ACKed = false;
          peVar9 = std::auto_ptr<PS2KeyboardAnalyzerResults>::operator->(&this->mResults);
          std::auto_ptr<PS2KeyboardAnalyzerSettings>::operator->(&this->mSettings);
          AnalyzerResults::AddMarker((ulonglong)peVar9,MVar4,(Channel *)0x2);
        }
        AnalyzerChannelData::AdvanceToNextEdge();
        AnalyzerChannelData::GetSampleNumber();
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mData);
      }
      UVar8 = AnalyzerChannelData::GetSampleNumber();
      *ending_frame = UVar8;
      bVar10 = true;
      DataBuilder::~DataBuilder(local_68);
    }
    else {
      bVar10 = false;
    }
  } while( true );
}

Assistant:

void PS2KeyboardAnalyzer::GetNextData( U64& starting_frame, U64& ending_frame, bool& DeviceToHost, U64& Payload, bool& ParityError,
                                       bool& ACKed )
{
    // Function built by looking at waveforms located here: http://retired.beyondlogic.org/keyboard/keybrd.htm
    // Note that there is conflicting information on the internet concerning the most popular websites for this protocol
    // some indicate that data is always sampled on falling clock edges, others indicate host to device communication
    // should be read on rising edges. Experimentation with Sony PS/2 PC and keyboard indicate host-to-device must be
    // read on rising clock edges, confirming some of the sources I found on the internet

    // if theres a transition in data before the clock goes high, request to send
    bool gotdata = false;
    while( !gotdata )
    {
        if( mClock->GetBitState() == BIT_LOW && mData->WouldAdvancingToAbsPositionCauseTransition( mClock->GetSampleOfNextEdge() ) &&
            mData->GetBitState() == BIT_HIGH )
            DeviceToHost = false;
        else
        {
            // advance until there is some activity on the channels
            while( mClock->GetBitState() == BIT_HIGH && mData->GetBitState() == BIT_HIGH )
            {
                U64 NextEdgeData = mData->GetSampleOfNextEdge();
                U64 NextEdgeClock = mClock->GetSampleOfNextEdge();

                if( NextEdgeData < NextEdgeClock )
                {
                    mClock->AdvanceToAbsPosition( NextEdgeData );
                    mData->AdvanceToAbsPosition( NextEdgeData );
                }
                else
                {
                    mClock->AdvanceToAbsPosition( NextEdgeClock );
                    mData->AdvanceToAbsPosition( NextEdgeClock );
                }
            }

            // if the first activity is a Request-To-Send, then the transmission will be from Host to Device
            if( mClock->GetBitState() == BIT_LOW && mData->WouldAdvancingToAbsPositionCauseTransition( mClock->GetSampleOfNextEdge() ) &&
                mData->GetBitState() == BIT_HIGH )
                DeviceToHost = false;
            else
                DeviceToHost = true;
        }

        // now we know direction, lets start getting the data
        mClock->AdvanceToNextEdge();
        mData->AdvanceToAbsPosition( mClock->GetSampleNumber() );

        // Now we are at the start bit of a transmission
        U64 current_location = mClock->GetSampleNumber();
        starting_frame = current_location;

        // the start bit is always 0, make sure this is zero, otherwise mark it as an error
        if( mData->GetBitState() == BIT_LOW )
        {
            // valid start bit, mark edge of clock and mark start bit with green circle
            mResults->AddMarker( current_location, AnalyzerResults::Start, mSettings->mDataChannel );

            if( DeviceToHost )
                mResults->AddMarker( current_location, AnalyzerResults::DownArrow, mSettings->mClockChannel );
            else
                mResults->AddMarker( current_location, AnalyzerResults::UpArrow, mSettings->mClockChannel );

            // prepare to collect the data
            U64 data = 0;
            DataBuilder data_builder;
            data_builder.Reset( &data, AnalyzerEnums::LsbFirst, 8 );

            // loop through the 8 bits of payload
            for( U32 i = 0; i < 8; i++ )
            {
                // advance to the payload bits beginning at the next falling edge
                mClock->AdvanceToNextEdge();
                mClock->AdvanceToNextEdge();
                current_location = mClock->GetSampleNumber();

                mData->AdvanceToAbsPosition( current_location );

                // mark the clock edge

                if( DeviceToHost )
                    mResults->AddMarker( current_location, AnalyzerResults::DownArrow, mSettings->mClockChannel );
                else
                    mResults->AddMarker( current_location, AnalyzerResults::UpArrow, mSettings->mClockChannel );

                // mark the data channel
                mResults->AddMarker( current_location, AnalyzerResults::Dot, mSettings->mDataChannel );

                // read the value of the bit
                data_builder.AddBit( mData->GetBitState() );
            }

            // set Payload = data for return variable
            Payload = data;

            // advance to the parity bit
            mClock->AdvanceToNextEdge();
            mClock->AdvanceToNextEdge();
            current_location = mClock->GetSampleNumber();

            // mark the clock edge
            if( DeviceToHost )
                mResults->AddMarker( current_location, AnalyzerResults::DownArrow, mSettings->mClockChannel );
            else
                mResults->AddMarker( current_location, AnalyzerResults::UpArrow, mSettings->mClockChannel );
            mData->AdvanceToAbsPosition( current_location );

            // read the parity bit from the stream and compare
            int received_parity;
            received_parity = mData->GetBitState();

            // now get expected value of parity bit
            if( AnalyzerHelpers::IsOdd( AnalyzerHelpers::GetOnesCount( data ) ) )
            {
                if( received_parity == BIT_LOW )
                {
                    // parity is correct
                    mResults->AddMarker( current_location, AnalyzerResults::Square, mSettings->mDataChannel );
                    ParityError = false;
                }
                else
                {
                    // parity is incorrect
                    mResults->AddMarker( current_location, AnalyzerResults::ErrorX, mSettings->mDataChannel );
                    ParityError = true;
                }
            }
            else
            {
                if( received_parity == BIT_HIGH )
                {
                    // parity is correct
                    mResults->AddMarker( current_location, AnalyzerResults::Square, mSettings->mDataChannel );
                    ParityError = false;
                }
                else
                {
                    // parity is incorrect
                    mResults->AddMarker( current_location, AnalyzerResults::ErrorX, mSettings->mDataChannel );
                    ParityError = true;
                }
            }

            // advance to the stop bit
            mClock->AdvanceToNextEdge();
            mClock->AdvanceToNextEdge();
            current_location = mClock->GetSampleNumber();
            mData->AdvanceToAbsPosition( current_location );

            // mark the clock edge
            if( DeviceToHost )
                mResults->AddMarker( current_location, AnalyzerResults::DownArrow, mSettings->mClockChannel );
            else
                mResults->AddMarker( current_location, AnalyzerResults::UpArrow, mSettings->mClockChannel );

            // make sure the stop bit is 1
            if( mData->GetBitState() == BIT_HIGH )
                mResults->AddMarker( current_location, AnalyzerResults::Stop, mSettings->mDataChannel );
            else
                mResults->AddMarker( current_location, AnalyzerResults::ErrorX, mSettings->mDataChannel );


            // if the transmit direction is host to device, check for the ACK
            if( !DeviceToHost )
            {
                // check for ACK from Device, read on falling edge
                mClock->AdvanceToNextEdge();
                mClock->AdvanceToNextEdge();
                current_location = mClock->GetSampleNumber();
                mData->AdvanceToAbsPosition( current_location );

                // mark the clock edge
                mResults->AddMarker( current_location, AnalyzerResults::UpArrow, mSettings->mClockChannel );

                // Ack should be 0, otherwise error
                if( mData->GetBitState() == BIT_HIGH )
                {
                    ACKed = true;
                    mResults->AddMarker( current_location, AnalyzerResults::ErrorX, mSettings->mDataChannel );
                }
                else
                {
                    ACKed = false;
                    mResults->AddMarker( current_location, AnalyzerResults::Square, mSettings->mDataChannel );
                }

                // since ACK is read on falling cycle, we need to advance to the edge of this pulse
                mClock->AdvanceToNextEdge();
                current_location = mClock->GetSampleNumber();
                mData->AdvanceToAbsPosition( current_location );
            }

            // all done, the tranmission ended here
            ending_frame = mClock->GetSampleNumber();
            gotdata = true;
        }
        else
        {
            gotdata = false;
        }
    }
}